

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O2

bool redit_mlist(CHAR_DATA *ch,char *argument)

{
  short sVar1;
  AREA_DATA_conflict *pAVar2;
  bool bVar3;
  bool bVar4;
  BUFFER *buffer;
  MOB_INDEX_DATA *pMVar5;
  char *pcVar6;
  int iVar7;
  int vnum;
  bool bVar8;
  char arg [4608];
  char buf [4608];
  
  one_argument(argument,arg);
  if (arg[0] == '\0') {
    pcVar6 = "Syntax:  mlist <all/name>\n\r";
  }
  else {
    buffer = new_buf();
    pAVar2 = ch->in_room->area;
    bVar3 = str_cmp(arg,"all");
    bVar8 = false;
    iVar7 = 0;
    for (vnum = (int)pAVar2->min_vnum; vnum <= pAVar2->max_vnum; vnum = vnum + 1) {
      pMVar5 = get_mob_index(vnum);
      if ((pMVar5 != (MOB_INDEX_DATA *)0x0) &&
         ((!bVar3 || (bVar4 = is_name(arg,pMVar5->player_name), bVar4)))) {
        sVar1 = pMVar5->vnum;
        pcVar6 = capitalize(pMVar5->short_descr);
        sprintf(buf,"[%5d] %-17.16s",(ulong)(uint)(int)sVar1,pcVar6);
        add_buf(buffer,buf);
        iVar7 = iVar7 + 1;
        bVar8 = true;
        if (iVar7 % 3 == 0) {
          add_buf(buffer,"\n\r");
        }
      }
    }
    if (bVar8) {
      if (iVar7 % 3 != 0) {
        add_buf(buffer,"\n\r");
      }
      pcVar6 = buf_string(buffer);
      page_to_char(pcVar6,ch);
      free_buf(buffer);
      return false;
    }
    pcVar6 = "Mobile(s) not found in this area.\n\r";
  }
  send_to_char(pcVar6,ch);
  return false;
}

Assistant:

bool redit_mlist(CHAR_DATA *ch, char *argument)
{
	MOB_INDEX_DATA *pMobIndex;
	AREA_DATA *pArea;
	char buf[MAX_STRING_LENGTH];
	BUFFER *buf1;
	char arg[MAX_INPUT_LENGTH];
	bool fAll, found;
	int vnum;
	int col = 0;

	one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		send_to_char("Syntax:  mlist <all/name>\n\r", ch);
		return false;
	}

	buf1 = new_buf();
	pArea = ch->in_room->area;
	/*    buf1[0] = '\0'; */
	fAll = !str_cmp(arg, "all");
	found = false;

	for (vnum = pArea->min_vnum; vnum <= pArea->max_vnum; vnum++)
	{
		pMobIndex = get_mob_index(vnum);

		if (pMobIndex != nullptr)
		{
			if (fAll || is_name(arg, pMobIndex->player_name))
			{
				found = true;

				sprintf(buf, "[%5d] %-17.16s", pMobIndex->vnum, capitalize(pMobIndex->short_descr));
				add_buf(buf1, buf);

				if (++col % 3 == 0)
					add_buf(buf1, "\n\r");
			}
		}
	}

	if (!found)
	{
		send_to_char("Mobile(s) not found in this area.\n\r", ch);
		return false;
	}

	if (col % 3 != 0)
		add_buf(buf1, "\n\r");

	page_to_char(buf_string(buf1), ch);
	free_buf(buf1);
	return false;
}